

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MeshDenoisingViaL0Minimization.cpp
# Opt level: O3

void __thiscall
MeshDenoisingViaL0Minimization::getInitialVerticesMatrix
          (MeshDenoisingViaL0Minimization *this,TriMesh *noisy_mesh,
          MatrixXd *initial_vertices_matrix)

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  mesh_ptr pPVar4;
  int iVar5;
  PropertyT<OpenMesh::VectorT<double,_3>_> *this_00;
  reference pvVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  VertexIter VVar10;
  VertexIter VVar11;
  undefined1 local_40 [8];
  VertexIter v_it;
  
  iVar5 = (**(code **)(*(long *)&(noisy_mesh->super_Mesh).
                                 super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                 .
                                 super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                      + 0x10))(noisy_mesh);
  lVar8 = (long)iVar5;
  if (lVar8 < 0) {
    __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (nbRows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (nbCols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (nbRows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (nbCols<=MaxColsAtCompileTime)) && nbRows>=0 && nbCols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/PlainObjectBase.h"
                  ,0xf1,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>]"
                 );
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)initial_vertices_matrix,lVar8 * 3,lVar8,3);
  VVar10 = OpenMesh::PolyConnectivity::vertices_begin((PolyConnectivity *)noisy_mesh);
  uVar9 = VVar10._8_8_;
  _local_40 = VVar10;
  VVar11 = OpenMesh::PolyConnectivity::vertices_end((PolyConnectivity *)noisy_mesh);
  if (VVar10.hnd_.super_BaseHandle.idx_.super_BaseHandle !=
      (BaseHandle)VVar11.hnd_.super_BaseHandle.idx_ || VVar10.mesh_ != VVar11.mesh_) {
    do {
      this_00 = OpenMesh::PropertyContainer::property<OpenMesh::VectorT<double,3>>
                          ((PropertyContainer *)
                           &(noisy_mesh->super_Mesh).
                            super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                            .
                            super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                            .field_0x8,
                           (BasePropHandleT<OpenMesh::VectorT<double,_3>_>)
                           (noisy_mesh->super_Mesh).
                           super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                           .
                           super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                           .points_.super_BasePropHandleT<OpenMesh::VectorT<double,_3>_>.
                           super_BaseHandle.idx_);
      iVar5 = (int)uVar9;
      pvVar6 = OpenMesh::PropertyT<OpenMesh::VectorT<double,_3>_>::operator[](this_00,iVar5);
      if (iVar5 < 0) {
LAB_00161bb7:
        __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/DenseCoeffsBase.h"
                      ,0x151,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>, Level = 1]"
                     );
      }
      lVar7 = (long)iVar5;
      lVar8 = (initial_vertices_matrix->
              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
      if ((lVar8 <= lVar7) ||
         (uVar9 = (initial_vertices_matrix->
                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols
         , (long)uVar9 < 1)) goto LAB_00161bb7;
      dVar1 = (pvVar6->super_VectorDataT<double,_3>).values_[1];
      dVar2 = (pvVar6->super_VectorDataT<double,_3>).values_[2];
      pdVar3 = (initial_vertices_matrix->
               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data;
      pdVar3[lVar7] = (pvVar6->super_VectorDataT<double,_3>).values_[0];
      if ((uVar9 == 1) || (pdVar3[lVar8 + lVar7] = dVar1, uVar9 < 3)) goto LAB_00161bb7;
      pdVar3[lVar8 * 2 + lVar7] = dVar2;
      pPVar4 = v_it.mesh_;
      v_it.mesh_._0_4_ = (BaseHandle)(BaseHandle)((int)local_40._8_4_.super_BaseHandle + 1);
      if ((ulong)pPVar4 >> 0x20 != 0) {
        OpenMesh::Iterators::
        GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
        ::skip_fwd((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                    *)local_40);
      }
      VVar10 = OpenMesh::PolyConnectivity::vertices_end((PolyConnectivity *)noisy_mesh);
      uVar9 = (ulong)(uint)v_it.mesh_._0_4_;
    } while (v_it.mesh_._0_4_ != (BaseHandle)VVar10.hnd_.super_BaseHandle.idx_ ||
             local_40 != (undefined1  [8])VVar10.mesh_);
  }
  return;
}

Assistant:

void MeshDenoisingViaL0Minimization::getInitialVerticesMatrix(TriMesh &noisy_mesh, Eigen::MatrixXd &initial_vertices_matrix)
{
    initial_vertices_matrix.resize((int)noisy_mesh.n_vertices(), 3);

    for(TriMesh::VertexIter v_it = noisy_mesh.vertices_begin(); v_it != noisy_mesh.vertices_end(); v_it++)
    {
        int index = v_it->idx();
        TriMesh::Point p = noisy_mesh.point(*v_it);
        initial_vertices_matrix(index, 0) = p[0];
        initial_vertices_matrix(index, 1) = p[1];
        initial_vertices_matrix(index, 2) = p[2];
    }
}